

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  Watcher *pWVar1;
  int iVar2;
  Lit p_00;
  uint uVar3;
  lbool lVar4;
  bool bVar5;
  vec<Minisat::Solver::Watcher,_int> *this_00;
  uint *puVar6;
  vec<Minisat::Solver::Watcher,_int> *this_01;
  Lit p_01;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int k;
  ulong uVar10;
  Watcher *pWVar11;
  undefined8 *puVar12;
  Watcher *pWVar13;
  Watcher *pWVar14;
  lbool local_85;
  Ref local_84;
  Watcher w;
  CRef local_6c;
  Lit p;
  
  local_6c = 0xffffffff;
  uVar8 = 0;
LAB_0010a928:
  iVar2 = this->qhead;
  if ((this->trail).sz <= iVar2) {
    this->propagations = this->propagations + (ulong)uVar8;
    this->simpDB_props = this->simpDB_props - (ulong)uVar8;
    return local_6c;
  }
  this->qhead = iVar2 + 1;
  p.x = (this->trail).data[iVar2].x;
  this_00 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
            ::lookup(&this->watches,&p);
  uVar8 = uVar8 + 1;
  pWVar11 = this_00->data;
  pWVar14 = pWVar11 + this_00->sz;
  pWVar13 = pWVar11;
LAB_0010a982:
  do {
    lVar9 = 0;
    while( true ) {
      pWVar1 = (Watcher *)((long)&pWVar11->cref + lVar9);
      if (pWVar1 == pWVar14) {
        vec<Minisat::Solver::Watcher,_int>::shrink
                  (this_00,(Size)((ulong)((long)pWVar14 + (-lVar9 - (long)pWVar13)) >> 3));
        goto LAB_0010a928;
      }
      p_00.x = *(int *)((long)&(pWVar11->blocker).x + lVar9);
      lVar4 = value(this,p_00);
      w.cref = CONCAT31(w.cref._1_3_,lVar4.value);
      bVar5 = lbool::operator==((lbool *)&w,l_True);
      if (!bVar5) break;
      *(Watcher *)((long)&pWVar13->cref + lVar9) = *pWVar1;
      lVar9 = lVar9 + 8;
    }
    local_84 = *(Ref *)((long)&pWVar11->cref + lVar9);
    puVar6 = RegionAllocator<unsigned_int>::operator[](&(this->ca).ra,local_84);
    uVar7 = p.x ^ 1;
    p_01.x = puVar6[1];
    uVar3 = puVar6[2];
    if (p_01.x == uVar7) {
      puVar6[1] = uVar3;
      puVar6[2] = uVar7;
      p_01.x = uVar3;
    }
    else if (uVar3 != uVar7) {
      __assert_fail("c[1] == false_lit",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                    ,0x211,"CRef Minisat::Solver::propagate()");
    }
    pWVar11 = (Watcher *)((long)&pWVar11[1].cref + lVar9);
    w.cref = local_84;
    w.blocker.x = p_01.x;
    if (p_01.x != p_00.x) {
      local_85 = value(this,p_01);
      bVar5 = lbool::operator==(&local_85,l_True);
      if (bVar5) {
        puVar12 = (undefined8 *)((long)&pWVar13->cref + lVar9);
        *puVar12 = CONCAT44(w.blocker.x,w.cref);
        pWVar13 = (Watcher *)(puVar12 + 1);
        goto LAB_0010a982;
      }
    }
    uVar10 = 2;
    do {
      if (*puVar6 >> 5 <= uVar10) {
        puVar12 = (undefined8 *)((long)&pWVar13->cref + lVar9);
        pWVar13 = (Watcher *)(puVar12 + 1);
        *puVar12 = CONCAT44(w.blocker.x,w.cref);
        local_85 = value(this,p_01);
        bVar5 = lbool::operator==(&local_85,l_False);
        if (bVar5) {
          this->qhead = (this->trail).sz;
          for (; pWVar11 < pWVar14; pWVar11 = pWVar11 + 1) {
            *pWVar13 = *pWVar11;
            pWVar13 = pWVar13 + 1;
          }
          local_6c = local_84;
        }
        else {
          uncheckedEnqueue(this,p_01,local_84);
        }
        goto LAB_0010a982;
      }
      local_85 = value(this,(Lit)puVar6[uVar10 + 1]);
      bVar5 = lbool::operator!=(&local_85,l_False);
      uVar10 = uVar10 + 1;
    } while (!bVar5);
    puVar6[2] = puVar6[uVar10];
    puVar6[uVar10] = uVar7;
    this_01 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>
              ::operator[](&(this->watches).occs,(Lit)(puVar6[2] ^ 1));
    vec<Minisat::Solver::Watcher,_int>::push(this_01,&w);
    pWVar13 = (Watcher *)((long)&pWVar13->cref + lVar9);
  } while( true );
}

Assistant:

CRef Solver::propagate()
{
    CRef    confl     = CRef_Undef;
    int     num_props = 0;

    while (qhead < trail.size()){
        Lit            p   = trail[qhead++];     // 'p' is enqueued fact to propagate.
        vec<Watcher>&  ws  = watches.lookup(p);
        Watcher        *i, *j, *end;
        num_props++;

        for (i = j = (Watcher*)ws, end = i + ws.size();  i != end;){
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if (value(blocker) == l_True){
                *j++ = *i++; continue; }

            // Make sure the false literal is data[1]:
            CRef     cr        = i->cref;
            Clause&  c         = ca[cr];
            Lit      false_lit = ~p;
            if (c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit     first = c[0];
            Watcher w     = Watcher(cr, first);
            if (first != blocker && value(first) == l_True){
                *j++ = w; continue; }

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False){
                    c[1] = c[k]; c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause; }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False){
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end)
                    *j++ = *i++;
            }else
                uncheckedEnqueue(first, cr);

        NextClause:;
        }
        ws.shrink(i - j);
    }
    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}